

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

uint32_t doctest::anon_unknown_15::anon_unknown_35::headerValue(uchar c)

{
  logic_error local_20 [19];
  uchar local_d;
  uint local_c;
  uchar c_local;
  
  if ((c & 0xe0) == 0xc0) {
    local_c = c & 0x1f;
  }
  else if ((c & 0xf0) == 0xe0) {
    local_c = c & 0xf;
  }
  else {
    if ((c & 0xf8) != 0xf0) {
      local_d = c;
      std::logic_error::logic_error
                (local_20,
                 "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/vendor/doctest/doctest.h:5101: Internal doctest error: Invalid multibyte utf-8 start byte encountered"
                );
      throw_exception<std::logic_error>(local_20);
    }
    local_c = c & 7;
  }
  return local_c;
}

Assistant:

uint32_t headerValue(unsigned char c) {
        if ((c & 0xE0) == 0xC0) {
            return c & 0x1F;
        }
        if ((c & 0xF0) == 0xE0) {
            return c & 0x0F;
        }
        if ((c & 0xF8) == 0xF0) {
            return c & 0x07;
        }
        DOCTEST_INTERNAL_ERROR("Invalid multibyte utf-8 start byte encountered");
    }